

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

string * __thiscall
lan::db::write_all_bits_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bits *bits)

{
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (bits != (db_bits *)0x0) {
    do {
      write_bit_abi_cxx11_(&local_50,this,bits,false);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bits = bits->nex;
    } while (bits != (db_bit *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_all_bits(db_bits * bits){
            db_bit * buffer = bits;
            std::string bits_str = "";
            while(buffer){
                bits_str += write_bit(buffer);
                buffer = buffer->nex;
            }
            return bits_str;
        }